

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::HasProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          JavascriptString *propertyNameString)

{
  byte bVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  uint uVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  uint uVar8;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
  *extraout_RDX;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
  *pSVar9;
  undefined1 local_38 [8];
  CharacterBuffer<char16_t> propertyName;
  
  pcVar6 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  bVar3 = PropertyRecord::IsPropertyNameNumeric(pcVar6,cVar4);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x1dd,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pcVar6 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)local_38);
  local_38 = (undefined1  [8])pcVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_38);
  this_00 = (this->propertyMap).ptr;
  propertyName.string.ptr._0_4_ = cVar4;
  uVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,(CharacterBuffer<char16_t> *)local_38);
  pSVar9 = extraout_RDX;
  if (-1 < (int)uVar5) {
    pSVar9 = (this_00->entries).ptr + uVar5;
  }
  uVar8 = 0;
  if ((-1 < (int)uVar5) &&
     (bVar1 = (pSVar9->
              super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              ).
              super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
              .
              super_ValueEntry<Js::DictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>_>
              .
              super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
              .value.Attributes, uVar8 = 0, (bVar1 & 8) == 0)) {
    uVar8 = (uint)(byte)(((pSVar9->
                          super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          ).
                          super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
                          .
                          super_ValueEntry<Js::DictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>_>
                          .
                          super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
                          .value.flags & IsShadowed) >> 1 | (bVar1 & 0x10) == 0);
  }
  return uVar8;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::HasProperty(DynamicObject* instance, JavascriptString* propertyNameString)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        DictionaryPropertyDescriptor<T>* descriptor;
        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            if ((descriptor->Attributes & PropertyDeleted) || !descriptor->HasNonLetConstGlobal())
            {
                return false;
            }
            return true;
        }

        return false;
    }